

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetCompileDefinitions
          (cmGeneratorTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *list,string *config,string *language)

{
  cmMakefile *this_00;
  cmLocalGenerator *this_01;
  Snapshot snapshot;
  bool bVar1;
  PolicyStatus PVar2;
  string *target;
  char *pcVar3;
  iterator __first;
  iterator __last;
  ulong uVar4;
  TargetPropertyEntry *this_02;
  PolicyID id;
  bool local_551;
  auto_ptr<cmCompiledGeneratorExpression> local_508;
  TargetPropertyEntry *local_500;
  undefined1 local_4f8 [24];
  auto_ptr<cmCompiledGeneratorExpression> cge;
  Snapshot local_4b8;
  cmListFileBacktrace local_4a0;
  undefined1 local_460 [8];
  cmGeneratorExpression ge;
  string local_400;
  undefined1 local_3e0 [8];
  ostringstream e;
  char *configProp;
  undefined1 local_240 [8];
  string configPropName;
  string local_218;
  undefined1 local_1f8 [8];
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  linkInterfaceCompileDefinitionsEntries;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  bool local_1ba;
  allocator local_1b9;
  undefined1 local_1b8 [6];
  bool debugDefines;
  allocator local_191;
  string local_190;
  char *local_170;
  char *debugProp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  string local_148;
  undefined1 local_118 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  uniqueOptions;
  string *language_local;
  string *config_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *list_local;
  cmGeneratorTarget *this_local;
  
  cmsys::
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::hash_set((hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
              *)&dagChecker.CheckResult);
  target = GetName_abi_cxx11_(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_148,"COMPILE_DEFINITIONS",
             (allocator *)
             ((long)&debugProperties.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_118,target,&local_148,
             (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&debugProperties.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&debugProp);
  this_00 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"CMAKE_DEBUG_TARGET_PROPERTIES",&local_191);
  pcVar3 = cmMakefile::GetDefinition(this_00,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  local_170 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_1b8,pcVar3,&local_1b9);
    cmSystemTools::ExpandListArgument
              ((string *)local_1b8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&debugProp,false);
    std::__cxx11::string::~string((string *)local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  }
  local_551 = false;
  if ((this->DebugCompileDefinitionsDone & 1U) == 0) {
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&debugProp);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&debugProp);
    local_1c8 = std::
                find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[20]>
                          (__first._M_current,__last._M_current,(char (*) [20])0x903689);
    linkInterfaceCompileDefinitionsEntries.
    super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&debugProp);
    local_551 = __gnu_cxx::operator!=
                          (&local_1c8,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&linkInterfaceCompileDefinitionsEntries.
                               super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  local_1ba = local_551;
  bVar1 = cmGlobalGenerator::GetConfigureDoneCMP0026(this->GlobalGenerator);
  if (bVar1) {
    this->DebugCompileDefinitionsDone = true;
  }
  processCompileDefinitions
            (this,&this->CompileDefinitionsEntries,list,
             (hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
              *)&dagChecker.CheckResult,(cmGeneratorExpressionDAGChecker *)local_118,config,
             (bool)(local_1ba & 1),language);
  std::
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::vector((vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
            *)local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_218,"INTERFACE_COMPILE_DEFINITIONS",
             (allocator *)(configPropName.field_2._M_local_buf + 0xf));
  AddInterfaceEntries(this,config,&local_218,
                      (vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                       *)local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)(configPropName.field_2._M_local_buf + 0xf));
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) goto LAB_0061da8d;
  cmsys::SystemTools::UpperCase((string *)&configProp,config);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                 "COMPILE_DEFINITIONS_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&configProp);
  std::__cxx11::string::~string((string *)&configProp);
  pcVar3 = GetProperty(this,(string *)local_240);
  if (pcVar3 != (char *)0x0) {
    PVar2 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0043);
    if (PVar2 != OLD) {
      if (PVar2 != WARN) goto LAB_0061da6e;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_400,(cmPolicies *)0x2b,id);
      std::operator<<((ostream *)local_3e0,(string *)&local_400);
      std::__cxx11::string::~string((string *)&local_400);
      this_01 = this->LocalGenerator;
      std::__cxx11::ostringstream::str();
      cmLocalGenerator::IssueMessage
                (this_01,AUTHOR_WARNING,(string *)&ge.Backtrace.Snapshot.Position.Position);
      std::__cxx11::string::~string((string *)&ge.Backtrace.Snapshot.Position.Position);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
    }
    cmState::Snapshot::Snapshot(&local_4b8,(cmState *)0x0);
    cmCommandContext::cmCommandContext((cmCommandContext *)&cge);
    snapshot.Position.Tree = local_4b8.Position.Tree;
    snapshot.State = local_4b8.State;
    snapshot.Position.Position = local_4b8.Position.Position;
    cmListFileBacktrace::cmListFileBacktrace(&local_4a0,snapshot,(cmCommandContext *)&cge);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_460,&local_4a0);
    cmListFileBacktrace::~cmListFileBacktrace(&local_4a0);
    cmCommandContext::~cmCommandContext((cmCommandContext *)&cge);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_4f8,local_460);
    local_4f8._8_8_ = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_4f8);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(local_4f8 + 0x10),
               (auto_ptr_ref<cmCompiledGeneratorExpression>)local_4f8._8_8_);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_4f8);
    this_02 = (TargetPropertyEntry *)operator_new(0x10);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
              (&local_508,(auto_ptr<cmCompiledGeneratorExpression> *)(local_4f8 + 0x10));
    TargetPropertyEntry::TargetPropertyEntry
              (this_02,&local_508,&TargetPropertyEntry::NoLinkImplItem);
    local_500 = this_02;
    std::
    vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
    ::push_back((vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                 *)local_1f8,&local_500);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_508);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(local_4f8 + 0x10));
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_460);
  }
LAB_0061da6e:
  std::__cxx11::string::~string((string *)local_240);
LAB_0061da8d:
  processCompileDefinitions
            (this,(vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                   *)local_1f8,list,
             (hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
              *)&dagChecker.CheckResult,(cmGeneratorExpressionDAGChecker *)local_118,config,
             (bool)(local_1ba & 1),language);
  cmDeleteAll<std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>>
            ((vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              *)local_1f8);
  std::
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::~vector((vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
             *)local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&debugProp);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_118);
  cmsys::
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::~hash_set((hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *)&dagChecker.CheckResult);
  return;
}

Assistant:

void cmGeneratorTarget::GetCompileDefinitions(std::vector<std::string> &list,
                                            const std::string& config,
                                            const std::string& language) const
{
  UNORDERED_SET<std::string> uniqueOptions;

  cmGeneratorExpressionDAGChecker dagChecker(this->GetName(),
                                             "COMPILE_DEFINITIONS", 0, 0);

  std::vector<std::string> debugProperties;
  const char *debugProp =
              this->Makefile->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp)
    {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
    }

  bool debugDefines = !this->DebugCompileDefinitionsDone
                          && std::find(debugProperties.begin(),
                                debugProperties.end(),
                                "COMPILE_DEFINITIONS")
                        != debugProperties.end();

  if (this->GlobalGenerator->GetConfigureDoneCMP0026())
    {
    this->DebugCompileDefinitionsDone = true;
    }

  processCompileDefinitions(this,
                            this->CompileDefinitionsEntries,
                            list,
                            uniqueOptions,
                            &dagChecker,
                            config,
                            debugDefines,
                            language);

  std::vector<cmGeneratorTarget::TargetPropertyEntry*>
    linkInterfaceCompileDefinitionsEntries;
  AddInterfaceEntries(
    this, config, "INTERFACE_COMPILE_DEFINITIONS",
    linkInterfaceCompileDefinitionsEntries);
  if (!config.empty())
    {
    std::string configPropName = "COMPILE_DEFINITIONS_"
                                        + cmSystemTools::UpperCase(config);
    const char *configProp = this->GetProperty(configPropName);
    if (configProp)
      {
      switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0043))
        {
        case cmPolicies::WARN:
          {
          std::ostringstream e;
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0043);
          this->LocalGenerator->IssueMessage(cmake::AUTHOR_WARNING,
                                       e.str());
          }
        case cmPolicies::OLD:
          {
          cmGeneratorExpression ge;
          cmsys::auto_ptr<cmCompiledGeneratorExpression> cge =
                                                      ge.Parse(configProp);
          linkInterfaceCompileDefinitionsEntries
                .push_back(new cmGeneratorTarget::TargetPropertyEntry(cge));
          }
          break;
        case cmPolicies::NEW:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::REQUIRED_IF_USED:
          break;
        }
      }
    }

  processCompileDefinitions(this,
                            linkInterfaceCompileDefinitionsEntries,
                            list,
                            uniqueOptions,
                            &dagChecker,
                            config,
                            debugDefines,
                            language);

  cmDeleteAll(linkInterfaceCompileDefinitionsEntries);
}